

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::attempt_remove_missing_keys<int>
          (tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,initializer_list<int> absent_keys)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  map<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *this_00;
  key_view kVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  pVar5;
  key_type key;
  span<const_std::byte,_18446744073709551615UL> absent_key;
  size_t local_88;
  size_t mem_use_before;
  size_type remove_result;
  long local_70;
  iterator local_68;
  map<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *local_60;
  long local_58;
  AssertHelper local_50;
  char local_48;
  AssertionResult gtest_ar;
  
  local_68 = absent_keys._M_array;
  if (this->parallel_test == false) {
    local_88 = (this->test_db).current_memory_use;
  }
  else {
    local_88 = 0;
  }
  if (absent_keys._M_len != 0) {
    this_00 = &this->values;
    local_58 = absent_keys._M_len << 2;
    local_70 = 0;
    local_60 = this_00;
    do {
      kVar4 = make_key(this,(long)*(int *)((long)local_68 + local_70));
      remove_result = (size_type)kVar4._M_extent._M_extent_value;
      key._M_extent._M_extent_value = (size_t)kVar4._M_ptr;
      key._M_ptr = (pointer)this;
      to_ikey((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)&stack0xffffffffffffffb8,key);
      pVar5 = std::
              _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::equal_range(&this_00->_M_t,(key_type *)&stack0xffffffffffffffb8);
      sVar1 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
      sVar2 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (gtest_ar._0_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_ar._0_8_);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((ulong)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl & 0xffffffff00000000);
      mem_use_before = sVar1 - sVar2;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&stack0xffffffffffffffb8,"(remove_result)","(0)",&mem_use_before,
                 (int *)&gtest_ar.message_);
      if (local_48 == '\0') {
        testing::Message::Message((Message *)&gtest_ar.message_);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x22d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
LAB_00201264:
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        if (gtest_ar._0_8_ == 0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
        return;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      absent_key._M_extent._M_extent_value = remove_result;
      absent_key._M_ptr = kVar4._M_ptr;
      tree_verifier<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
      ::
      do_try_remove_missing_key<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,std::span<std::byte_const,18446744073709551615ul>>
                ((tree_verifier<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                  *)this,absent_key);
      this_00 = local_60;
      if (this->parallel_test == false) {
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(this->test_db).current_memory_use;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&stack0xffffffffffffffb8,"(mem_use_before)",
                   "(test_db.get_current_memory_use())",&local_88,
                   (unsigned_long *)&gtest_ar.message_);
        if (local_48 == '\0') {
          testing::Message::Message((Message *)&gtest_ar.message_);
          if (gtest_ar._0_8_ == 0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x231,pcVar3);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
          goto LAB_00201264;
        }
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
      }
      local_70 = local_70 + 4;
    } while (local_58 != local_70);
  }
  return;
}

Assistant:

void attempt_remove_missing_keys(std::initializer_list<T> absent_keys) {
#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_before =
        parallel_test ? 0 : test_db.get_current_memory_use();
#endif  // UNODB_DETAIL_WITH_STATS

    for (const auto absent_key : absent_keys) {
      const auto k{coerce_key(absent_key)};

      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 0);
      do_try_remove_missing_key(k);
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
      }
#endif  // UNODB_DETAIL_WITH_STATS
    }
  }